

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Stress::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *node;
  
  node = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  DVar1 = this->m_method;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,pCVar2->m_testCtx,"indices","Index tests")
  ;
  node[1]._vptr_TestNode = (_func_int **)pCVar2;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217efb0;
  *(DrawMethod *)&node[1].m_testCtx = DVar1;
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed = (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED);

	DE_ASSERT(indexed);
	DE_UNREF(indexed);

	this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
}